

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O1

Modes __thiscall ON_RenderChannels::Mode(ON_RenderChannels *this)

{
  ON_InternalXMLImpl *this_00;
  bool bVar1;
  ON_wString s;
  undefined1 auStack_208 [256];
  ON_XMLVariant local_108;
  
  this_00 = &this->m_impl->super_ON_InternalXMLImpl;
  ::ON_XMLVariant::ON_XMLVariant(&local_108,L"automatic");
  ON_InternalXMLImpl::GetParameter
            ((ON_XMLVariant *)(auStack_208 + 8),this_00,
             L"render-content-manager-document/settings/rendering/render-channels",L"mode",
             &local_108);
  ::ON_XMLVariant::AsString((ON_XMLVariant *)auStack_208);
  ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)(auStack_208 + 8));
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  bVar1 = ::operator==(L"custom",(ON_wString *)auStack_208);
  ON_wString::~ON_wString((ON_wString *)auStack_208);
  return (uint)bVar1;
}

Assistant:

ON_RenderChannels::Modes ON_RenderChannels::Mode(void) const
{
  auto mode = Modes::Automatic;

  const ON_wString s = m_impl->GetParameter(XMLPath(), ON_RDK_RCH_MODE, ON_RDK_RCH_MODE_AUTOMATIC).AsString();
  if (ON_RDK_RCH_MODE_CUSTOM == s)
    mode = Modes::Custom;

  return mode;
}